

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::copyTexImage1D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int border)

{
  uint uVar1;
  Texture1D *pTVar2;
  long lVar3;
  uint uVar4;
  int y_00;
  ulong uVar5;
  pointer pTVar6;
  Texture1D *pTVar7;
  int x_00;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess src;
  TextureFormat local_98;
  MultisamplePixelBufferAccess local_90;
  MultisampleConstPixelBufferAccess local_68;
  
  pTVar6 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  getReadColorbuffer(&local_90,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_68,&local_90);
  if ((border == 0) && (-1 < (width | level))) {
    if ((local_68.m_access.m_size.m_data[0] == 0) ||
       ((local_68.m_access.m_size.m_data[1] == 0 || (local_68.m_access.m_size.m_data[2] == 0)))) {
LAB_009873be:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    local_98 = mapInternalFormat(internalFormat);
    if ((local_98.order == CHANNELORDER_LAST || (ulong)local_98 >> 0x20 == 0x26) ||
       (target != 0xde0)) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    uVar1 = (this->m_limits).maxTexture2DSize;
    if (width <= (int)uVar1) {
      if (uVar1 == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar4)) {
        pTVar2 = pTVar6->tex1DBinding;
        pTVar7 = &pTVar6->default1DTex;
        if (pTVar2 != (Texture1D *)0x0) {
          pTVar7 = pTVar2;
        }
        if ((pTVar7->super_Texture).m_immutable == true) {
          if ((((0xd < (uint)level) ||
               (uVar5 = (ulong)(uint)level,
               *(long *)((long)((pTVar7->m_levels).m_data + uVar5) + 8) == 0)) ||
              (local_90.m_access.super_ConstPixelBufferAccess.m_format =
                    *(TextureFormat *)((pTVar7->m_levels).m_access + uVar5),
              local_98.order != local_90.m_access.super_ConstPixelBufferAccess.m_format.order)) ||
             ((local_98.type != local_90.m_access.super_ConstPixelBufferAccess.m_format.type ||
              (*(int *)((long)((pTVar7->m_levels).m_access + uVar5) + 8) != width))))
          goto LAB_009873be;
        }
        else {
          rc::TextureLevelArray::allocLevel(&pTVar7->m_levels,level,&local_98,width,1,1);
          uVar5 = (ulong)level;
          local_90.m_access.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar7->m_levels).m_access + uVar5);
        }
        lVar3 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar3] =
               *(int *)((long)((pTVar7->m_levels).m_access + uVar5) + 8U + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar3] =
               *(int *)((long)((pTVar7->m_levels).m_access + uVar5) + 0x14U + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)((pTVar7->m_levels).m_access + uVar5) + 0x20);
        if (width < 1) {
          return;
        }
        x_00 = 0;
        do {
          y_00 = x + x_00;
          if ((-1 < y_00) && (y_00 < local_68.m_access.m_size.m_data[1])) {
            rr::resolveMultisamplePixel
                      ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_68,
                       y_00);
            tcu::PixelBufferAccess::setPixel
                      (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,x_00,0,0);
          }
          x_00 = x_00 + 1;
        } while (width != x_00);
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage1D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}